

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SetRepeatedEnumValueInternal
          (Reflection *this,Message *message,FieldDescriptor *field,int index,int value)

{
  bool bVar1;
  undefined4 in_ECX;
  FieldDescriptor *in_RDX;
  Message *in_RDI;
  undefined4 in_R8D;
  int in_stack_000000d4;
  int in_stack_000000d8;
  int in_stack_000000dc;
  ExtensionSet *in_stack_000000e0;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Reflection *in_stack_ffffffffffffffd0;
  
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    MutableExtensionSet(in_stack_ffffffffffffffd0,
                        (Message *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    FieldDescriptor::number(in_RDX);
    internal::ExtensionSet::SetRepeatedEnum
              (in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,in_stack_000000d4);
  }
  else {
    SetRepeatedField<int>
              ((Reflection *)CONCAT44(in_ECX,in_R8D),in_RDI,
               (FieldDescriptor *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void Reflection::SetRepeatedEnumValueInternal(Message* message,
                                              const FieldDescriptor* field,
                                              int index, int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetRepeatedEnum(field->number(), index,
                                                  value);
  } else {
    SetRepeatedField<int>(message, field, index, value);
  }
}